

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_1d_test.cc
# Opt level: O3

void anon_unknown.dwarf_1f8c447::blend_a64_hmask_ref
               (uint8_t *dst,uint32_t dst_stride,uint8_t *src0,uint32_t src0_stride,uint8_t *src1,
               uint32_t src1_stride,uint8_t *mask,int w,int h)

{
  long lVar1;
  uint8_t mask2d [256] [256];
  
  if (0 < h) {
    lVar1 = 0;
    do {
      if (0 < w) {
        memcpy(mask2d[0] + lVar1,mask,(ulong)(uint)w);
      }
      lVar1 = lVar1 + 0x100;
    } while ((ulong)(uint)h << 8 != lVar1);
  }
  aom_blend_a64_mask_c(dst,dst_stride,src0,src0_stride,src1,src1_stride,mask2d[0],0x100,w,h,0,0);
  return;
}

Assistant:

static void blend_a64_hmask_ref(uint8_t *dst, uint32_t dst_stride,
                                const uint8_t *src0, uint32_t src0_stride,
                                const uint8_t *src1, uint32_t src1_stride,
                                const uint8_t *mask, int w, int h) {
  uint8_t mask2d[BlendA64Mask1DTest8B::kMaxMaskSize]
                [BlendA64Mask1DTest8B::kMaxMaskSize];

  for (int row = 0; row < h; ++row)
    for (int col = 0; col < w; ++col) mask2d[row][col] = mask[col];

  aom_blend_a64_mask_c(dst, dst_stride, src0, src0_stride, src1, src1_stride,
                       &mask2d[0][0], BlendA64Mask1DTest8B::kMaxMaskSize, w, h,
                       0, 0);
}